

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20240722::debugging_internal::ParseCharClass(State *state,char *char_class)

{
  bool bVar1;
  char *pcVar2;
  State *local_48;
  char *p;
  ComplexityGuard local_28;
  ComplexityGuard guard;
  char *char_class_local;
  State *state_local;
  
  guard.state_ = (State *)char_class;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_28,state);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_28);
  if (bVar1) {
    state_local._7_1_ = false;
  }
  else {
    pcVar2 = RemainingInput(state);
    if (*pcVar2 == '\0') {
      state_local._7_1_ = false;
    }
    else {
      for (local_48 = guard.state_; *(char *)&local_48->mangled_begin != '\0';
          local_48 = (State *)((long)&local_48->mangled_begin + 1)) {
        pcVar2 = RemainingInput(state);
        if (*pcVar2 == *(char *)&local_48->mangled_begin) {
          (state->parse_state).mangled_idx = (state->parse_state).mangled_idx + 1;
          anon_unknown_3::UpdateHighWaterMark(state);
          state_local._7_1_ = true;
          goto LAB_00104ac4;
        }
      }
      state_local._7_1_ = false;
    }
  }
LAB_00104ac4:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_28);
  return state_local._7_1_;
}

Assistant:

static bool ParseCharClass(State *state, const char *char_class) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (RemainingInput(state)[0] == '\0') {
    return false;
  }
  const char *p = char_class;
  for (; *p != '\0'; ++p) {
    if (RemainingInput(state)[0] == *p) {
      ++state->parse_state.mangled_idx;
      UpdateHighWaterMark(state);
      return true;
    }
  }
  return false;
}